

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O3

void __thiscall QStatusBar::reformat(QStatusBar *this)

{
  long lVar1;
  long lVar2;
  Representation RVar3;
  uint uVar4;
  QLayout *this_00;
  QLayout *layout;
  QSize QVar5;
  QSize QVar6;
  int extraout_var;
  long lVar7;
  int size;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QMargins local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (*(long **)(lVar1 + 0x288) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x288) + 0x20))();
  }
  lVar7 = *(long *)(lVar1 + 0x298);
  this_00 = (QLayout *)operator_new(0x20);
  if (lVar7 == 0) {
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00,&this->super_QWidget);
    *(QLayout **)(lVar1 + 0x288) = this_00;
    local_48.m_left.m_i = 0;
    local_48.m_top.m_i = 0;
    local_48.m_right.m_i = 0;
    local_48.m_bottom.m_i = 0;
    QLayout::setContentsMargins(this_00,&local_48);
  }
  else {
    QHBoxLayout::QHBoxLayout((QHBoxLayout *)this_00,&this->super_QWidget);
    *(QLayout **)(lVar1 + 0x288) = this_00;
    local_48.m_left.m_i = 0;
    local_48.m_top.m_i = 0;
    local_48.m_right.m_i = 0;
    local_48.m_bottom.m_i = 0;
    QLayout::setContentsMargins(this_00,&local_48);
    this_00 = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00);
    QBoxLayout::addLayout(*(QBoxLayout **)(lVar1 + 0x288),this_00,0);
  }
  QBoxLayout::addSpacing((QBoxLayout *)this_00,3);
  layout = (QLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)layout);
  uVar11 = 0;
  QBoxLayout::addLayout((QBoxLayout *)this_00,layout,0);
  QBoxLayout::addSpacing((QBoxLayout *)layout,2);
  (**(code **)(*(long *)layout + 0x68))(layout,6);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_48,&((this->super_QWidget).data)->fnt);
  uVar4 = QFontMetrics::height();
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_48);
  uVar8 = (ulong)uVar4;
  if (*(long *)(lVar1 + 0x268) != 0) {
    lVar7 = 0;
    uVar11 = 0;
    uVar10 = (ulong)uVar4;
    do {
      lVar2 = *(long *)(lVar1 + 0x260);
      uVar8 = uVar10;
      if (*(int *)(lVar2 + 0xc + lVar7) == 1) break;
      QBoxLayout::addWidget
                ((QBoxLayout *)layout,*(QWidget **)(lVar2 + lVar7),*(int *)(lVar2 + 8 + lVar7),
                 (Alignment)0x0);
      QVar5 = qSmartMinSize(*(QWidget **)(lVar2 + lVar7));
      QVar6 = QWidget::maximumSize(*(QWidget **)(lVar2 + lVar7));
      RVar3.m_i = QVar6.ht.m_i.m_i;
      if (QVar5.ht.m_i.m_i < QVar6.ht.m_i.m_i) {
        RVar3.m_i = QVar5.ht.m_i.m_i;
      }
      uVar8 = (ulong)(uint)RVar3.m_i;
      if (RVar3.m_i < (int)uVar10) {
        uVar8 = uVar10;
      }
      uVar11 = uVar11 + 1;
      lVar7 = lVar7 + 0x10;
      uVar10 = uVar8;
    } while (uVar11 < *(ulong *)(lVar1 + 0x268));
  }
  iVar9 = (int)uVar8;
  QBoxLayout::addStretch((QBoxLayout *)layout,0);
  if (uVar11 < *(ulong *)(lVar1 + 0x268)) {
    lVar7 = uVar11 << 4;
    do {
      lVar2 = *(long *)(lVar1 + 0x260);
      QBoxLayout::addWidget
                ((QBoxLayout *)layout,*(QWidget **)(lVar2 + lVar7),*(int *)(lVar2 + 8 + lVar7),
                 (Alignment)0x0);
      QVar6 = qSmartMinSize(*(QWidget **)(lVar2 + lVar7));
      QVar5 = QWidget::maximumSize(*(QWidget **)(lVar2 + lVar7));
      if (QVar6.ht.m_i.m_i < QVar5.ht.m_i.m_i) {
        QVar5 = QVar6;
      }
      uVar10 = (ulong)QVar5 >> 0x20;
      if (QVar5.ht.m_i.m_i < (int)uVar8) {
        uVar10 = uVar8;
      }
      uVar8 = uVar10;
      iVar9 = (int)uVar8;
      uVar11 = uVar11 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar11 < *(ulong *)(lVar1 + 0x268));
  }
  size = iVar9;
  if (*(long **)(lVar1 + 0x298) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x298) + 0x70))();
    size = extraout_var;
    if (extraout_var < iVar9) {
      size = iVar9;
    }
    QBoxLayout::addSpacing(*(QBoxLayout **)(lVar1 + 0x288),1);
    QBoxLayout::addWidget
              (*(QBoxLayout **)(lVar1 + 0x288),*(QWidget **)(lVar1 + 0x298),0,(Alignment)0x40);
  }
  QBoxLayout::addStrut((QBoxLayout *)layout,size);
  *(int *)(lVar1 + 0x2a4) = size;
  QBoxLayout::addSpacing((QBoxLayout *)this_00,2);
  QLayout::activate(*(QLayout **)(lVar1 + 0x288));
  QWidget::update(&this->super_QWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStatusBar::reformat()
{
    Q_D(QStatusBar);
    if (d->box)
        delete d->box;

    QBoxLayout *vbox;
#if QT_CONFIG(sizegrip)
    if (d->resizer) {
        d->box = new QHBoxLayout(this);
        d->box->setContentsMargins(QMargins());
        vbox = new QVBoxLayout;
        d->box->addLayout(vbox);
    } else
#endif
    {
        vbox = d->box = new QVBoxLayout(this);
        d->box->setContentsMargins(QMargins());
    }
    vbox->addSpacing(3);
    QBoxLayout* l = new QHBoxLayout;
    vbox->addLayout(l);
    l->addSpacing(2);
    l->setSpacing(6);

    int maxH = fontMetrics().height();

    qsizetype i;
    for (i = 0; i < d->items.size(); ++i) {
        const auto &item = d->items.at(i);
        if (item.isPermanent())
            break;
        l->addWidget(item.widget, item.stretch);
        int itemH = qMin(qSmartMinSize(item.widget).height(), item.widget->maximumHeight());
        maxH = qMax(maxH, itemH);
    }

    l->addStretch(0);

    for (; i < d->items.size(); ++i) {
        const auto &item = d->items.at(i);
        l->addWidget(item.widget, item.stretch);
        int itemH = qMin(qSmartMinSize(item.widget).height(), item.widget->maximumHeight());
        maxH = qMax(maxH, itemH);
    }
#if QT_CONFIG(sizegrip)
    if (d->resizer) {
        maxH = qMax(maxH, d->resizer->sizeHint().height());
        d->box->addSpacing(1);
        d->box->addWidget(d->resizer, 0, Qt::AlignBottom);
    }
#endif
    l->addStrut(maxH);
    d->savedStrut = maxH;
    vbox->addSpacing(2);
    d->box->activate();
    update();
}